

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

llb_buildsystem_t *
llb_buildsystem_create(llb_buildsystem_delegate_t delegate,llb_buildsystem_invocation_t invocation)

{
  llb_buildsystem_invocation_t cAPIInvocation;
  undefined1 auVar1 [168];
  CAPIBuildSystem *this;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  llb_buildsystem_delegate_t in_stack_fffffffffffffda8;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0 [29];
  
  auVar1 = (undefined1  [168])delegate._64_168_;
  bVar5 = 0;
  if (delegate.lookup_tool == (_func_llb_buildsystem_tool_t_ptr_void_ptr_llb_data_t_ptr *)0x0) {
    __assert_fail("delegate.handle_diagnostic",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fc,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  delegate._64_168_ = auVar1;
  if (delegate.should_command_start == (_func_bool_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
    __assert_fail("delegate.command_started",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fd,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_started == (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)0x0) {
    __assert_fail("delegate.command_finished",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fe,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_finished ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)0x0) {
    __assert_fail("delegate.command_found_discovered_dependency",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4ff,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.cannot_build_node_due_to_multiple_producers ==
      (_func_void_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t *)0x0)
  {
    __assert_fail("delegate.command_process_started",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x500,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_started ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr *)0x0) {
    __assert_fail("delegate.command_process_had_error",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x501,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_had_error ==
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
       *)0x0) {
    __assert_fail("delegate.command_process_had_output",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x502,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_process_had_output !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
       *)0x0) {
    this = (CAPIBuildSystem *)operator_new(0x1f8);
    memcpy(local_f0,&stack0x00000008,0xe8);
    memcpy(&local_120,&delegate.should_resolve_cycle,0x30);
    puVar3 = local_f0;
    puVar4 = (undefined8 *)&stack0xfffffffffffffda8;
    for (lVar2 = 0x1d; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    cAPIInvocation.dbPath = (char *)uStack_118;
    cAPIInvocation.buildFilePath = (char *)local_120;
    cAPIInvocation.traceFilePath = (char *)local_110;
    cAPIInvocation.environment = (char **)uStack_108;
    cAPIInvocation.showVerboseStatus = (bool)(undefined1)local_100;
    cAPIInvocation.useSerialBuild = (bool)local_100._1_1_;
    cAPIInvocation._34_2_ = local_100._2_2_;
    cAPIInvocation.schedulerAlgorithm = local_100._4_4_;
    cAPIInvocation.schedulerLanes = (undefined4)uStack_f8;
    cAPIInvocation.qos = uStack_f8._4_4_;
    anon_unknown.dwarf_1b8a13::CAPIBuildSystem::CAPIBuildSystem
              (this,in_stack_fffffffffffffda8,cAPIInvocation);
    return (llb_buildsystem_t *)this;
  }
  __assert_fail("delegate.command_process_finished",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x503,
                "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
               );
}

Assistant:

llb_buildsystem_t* llb_buildsystem_create(
    llb_buildsystem_delegate_t delegate,
    llb_buildsystem_invocation_t invocation) {
  // Check that all required methods are provided.
  assert(delegate.handle_diagnostic);
  assert(delegate.command_started);
  assert(delegate.command_finished);
  assert(delegate.command_found_discovered_dependency);
  assert(delegate.command_process_started);
  assert(delegate.command_process_had_error);
  assert(delegate.command_process_had_output);
  assert(delegate.command_process_finished);
         
  return (llb_buildsystem_t*) new CAPIBuildSystem(delegate, invocation);
}